

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

void __thiscall cppforth::Forth::filePosition(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long *local_48 [2];
  long local_38 [2];
  
  requireDStackDepth(this,1,"FILE-POSITION");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"FILE-POSITION","");
  GetFileHandle((Forth *)&local_58,(Cell)this,(string *)(ulong)uVar1,(errorCodes)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  lVar2 = *(long *)(*local_58 + -0x18);
  if (*(int *)((long)local_58 + lVar2 + 0x20) != 0) {
    std::ios::clear((int)local_58 + (int)lVar2);
    lVar2 = *(long *)(*local_58 + -0x18);
  }
  std::ios::clear((int)lVar2 + (int)local_58);
  uVar3 = std::istream::tellg();
  ForthStack<unsigned_int>::setTop(this_00,0,(uint)uVar3);
  ForthStack<unsigned_int>::push(this_00,(uint)((ulong)uVar3 >> 0x20));
  ForthStack<unsigned_int>::push
            (this_00,-(*(uint *)((long)local_58 + *(long *)(*local_58 + -0x18) + 0x20) & 1) &
                     0xffffffbf);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void filePosition() {
	REQUIRE_DSTACK_DEPTH(1, "FILE-POSITION");
	auto h = (dStack.getTop()); 
	auto f = GetFileHandle(h, "FILE-POSITION", errorFileSize);
	auto status = f->rdstate();
	if (status != 0) f->clear();
	f->clear();
	DCell position(f->tellg());
	status = f->rdstate();
	dStack.setTop(0, position.data_.Cells.lo);
	dStack.push(position.data_.Cells.hi);
	dStack.push(f->bad() ? Cell(errorFilePosition) : 0);
}